

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description.hpp
# Opt level: O0

void __thiscall duckdb::TableDescription::~TableDescription(TableDescription *this)

{
  string *in_RDI;
  
  vector<duckdb::ColumnDefinition,_true>::~vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x53841c);
  std::__cxx11::string::~string(in_RDI + 0x40);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

TableDescription(const string &database_name, const string &schema_name, const string &table_name)
	    : database(database_name), schema(schema_name), table(table_name) {}